

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O3

void __thiscall TestEncoding::testEncoding<long>(TestEncoding *this,long start,long stop)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"testing from ",0xd);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," to ",4);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," inclusive\n",0xb);
  if (start <= stop) {
    do {
      compare(this,start);
      start = start + 1;
    } while (stop + 1 != start);
  }
  return;
}

Assistant:

void testEncoding(IntType start, IntType stop)
    {
        std::cout << "testing from " << start << " to " << stop << " inclusive\n";
        IntType val = start;
        IntType diff = stop - start + 1;

        for(IntType i = 0; i < diff; ++i) {
            compare(val+i);
        }
    }